

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

mbedtls_mpi_uint
mbedtls_mpi_core_add_if(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,size_t limbs,uint cond)

{
  mbedtls_ct_condition_t condition;
  mbedtls_mpi_uint mVar1;
  ulong uVar2;
  mbedtls_mpi_uint t;
  mbedtls_mpi_uint add;
  size_t i;
  mbedtls_ct_condition_t do_add;
  mbedtls_mpi_uint c;
  uint cond_local;
  size_t limbs_local;
  mbedtls_mpi_uint *A_local;
  mbedtls_mpi_uint *X_local;
  
  do_add = 0;
  condition = mbedtls_ct_bool((ulong)cond);
  for (add = 0; add < limbs; add = add + 1) {
    mVar1 = mbedtls_ct_mpi_uint_if_else_0(condition,A[add]);
    uVar2 = mVar1 + do_add + X[add];
    do_add = (long)(int)(uint)(uVar2 < mVar1) + (long)(int)(uint)(do_add + X[add] < X[add]);
    X[add] = uVar2;
  }
  return do_add;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_add_if(mbedtls_mpi_uint *X,
                                         const mbedtls_mpi_uint *A,
                                         size_t limbs,
                                         unsigned cond)
{
    mbedtls_mpi_uint c = 0;

    mbedtls_ct_condition_t do_add = mbedtls_ct_bool(cond);

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint add = mbedtls_ct_mpi_uint_if_else_0(do_add, A[i]);
        mbedtls_mpi_uint t = c + X[i];
        c = (t < X[i]);
        t += add;
        c += (t < add);
        X[i] = t;
    }

    return c;
}